

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::EmitPropStore
          (ByteCodeGenerator *this,RegSlot rhsLocation,Symbol *sym,IdentPtr pid,FuncInfo *funcInfo,
          bool isLetDecl,bool isConstDecl,bool isFncDeclVar,bool skipUseBeforeDeclarationCheck)

{
  uint uVar1;
  Scope *symScope;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  ushort uVar6;
  OpCode OVar7;
  PropertyId PVar8;
  uint uVar9;
  RegSlot RVar10;
  ByteCodeLabel labelID;
  Scope **ppSVar11;
  undefined4 *puVar12;
  Scope *scope;
  Scope *scope_00;
  Type *pTVar13;
  uint32 slotId1;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 aVar14;
  ByteCodeGenerator *this_00;
  undefined7 in_register_00000089;
  ByteCodeWriter *this_01;
  Scope *scope_01;
  FuncInfo *funcInfo_00;
  int i;
  int index;
  undefined1 local_c0 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  DynamicLoadRecord local_88;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 local_7c;
  undefined4 *local_78;
  ByteCodeLabel local_6c;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 local_68;
  undefined4 local_64;
  char local_5d;
  PropertyId local_5c;
  ByteCodeGenerator *pBStack_58;
  PropertyId envIndex;
  ByteCodeGenerator *local_50;
  RegSlot local_44;
  FuncInfo *local_40;
  bool local_31;
  
  local_64 = (undefined4)CONCAT71(in_register_00000089,isLetDecl);
  local_5d = skipUseBeforeDeclarationCheck;
  local_6c = CONCAT31(local_6c._1_3_,isFncDeclVar);
  local_31 = isConstDecl;
  local_5c = -1;
  if ((sym == (Symbol *)0x0) || ((sym->field_0x42 & 8) != 0)) {
    ppSVar11 = &this->globalScope;
  }
  else {
    ppSVar11 = &sym->scope;
  }
  symScope = *ppSVar11;
  recList._40_8_ = pid;
  local_44 = rhsLocation;
  if (symScope == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1224,"(symScope)","symScope");
    if (!bVar3) goto LAB_0075c11b;
    *puVar12 = 0;
  }
  if ((sym != (Symbol *)0x0) && ((sym->field_0x43 & 0x40) != 0)) {
    if ((local_31 == false) &&
       ((sym->decl != (ParseNode *)0x0 && (sym->decl->nop == knopConstDecl)))) {
      Js::ByteCodeWriter::W1(&this->m_writer,RuntimeTypeError,0x41f);
    }
    EmitModuleExportAccess(this,sym,StModuleSlot,local_44,funcInfo);
    return;
  }
  local_50 = (ByteCodeGenerator *)sym;
  local_40 = funcInfo;
  if ((char)local_6c == '\0') {
    aVar14.index = 0xffffffff;
    scope = (Scope *)0x0;
  }
  else {
    scope = (Scope *)0x0;
    do {
      scope = FindScopeForSym(this,symScope,scope,&local_5c,funcInfo);
    } while (scope != symScope);
    aVar14 = (anon_union_4_2_6390a042_for_DynamicLoadRecord_2)scope->location;
  }
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_ =
       this->alloc;
  local_c0 = (undefined1  [8])&PTR_IsReadOnly_0137a130;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
  _0_4_ = 0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  local_78 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  this_01 = &this->m_writer;
  scope_01 = scope;
  local_7c = aVar14;
  local_68 = aVar14;
  pBStack_58 = this;
  while (scope_00 = scope, (char)local_6c == '\0') {
    scope_00 = FindScopeForSym(pBStack_58,symScope,scope_01,&local_5c,local_40);
    if (scope_00 == pBStack_58->globalScope) {
LAB_0075ba39:
      local_7c = local_68;
      break;
    }
    if (local_5c == -1) {
      if (scope_00->func != local_40) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_78 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x124f,"(funcInfo == scope->GetFunc())","funcInfo == scope->GetFunc()");
        if (!bVar3) goto LAB_0075c11b;
        *local_78 = 0;
      }
      local_68 = (anon_union_4_2_6390a042_for_DynamicLoadRecord_2)scope_00->location;
    }
    if (scope_00 == symScope) goto LAB_0075ba39;
    if ((scope_00 == (Scope *)0x0) || (uVar6 = *(ushort *)&scope_00->field_0x44, (uVar6 & 1) == 0))
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_78 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1259,"(scope && scope->GetIsDynamic())","scope && scope->GetIsDynamic()"
                        );
      if (!bVar3) goto LAB_0075c11b;
      *local_78 = 0;
      uVar6 = *(ushort *)&scope_00->field_0x44;
    }
    if ((uVar6 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_78 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x125a,"(scope->GetIsObject())","scope->GetIsObject()");
      if (!bVar3) goto LAB_0075c11b;
      *local_78 = 0;
    }
    DynamicLoadRecord::DynamicLoadRecord(&local_88);
    local_88.label = Js::ByteCodeWriter::DefineLabel(this_01);
    if (local_50 == (ByteCodeGenerator *)0x0) {
      PVar8 = *(PropertyId *)(recList._40_8_ + 0x1c);
    }
    else {
      PVar8 = Symbol::EnsurePosition((Symbol *)local_50,pBStack_58);
    }
    uVar9 = FuncInfo::FindOrAddReferencedPropertyId(local_40,PVar8);
    if (scope_00->scopeType == ScopeType_With) {
      if (local_5c == -1) {
        Js::ByteCodeWriter::BrProperty
                  (this_01,BrOnHasProperty,local_88.label,local_68.instance,uVar9);
        local_88.kind = LocalWith;
        local_88.field_2 = local_68;
      }
      else {
        aVar14.index = local_5c + 1;
        Js::ByteCodeWriter::BrEnvProperty
                  (this_01,BrOnHasEnvProperty,local_88.label,uVar9,aVar14.index);
        local_88.kind = EnvWith;
        local_88.field_2.index = aVar14.index;
      }
    }
    else if (local_5c == -1) {
      Js::ByteCodeWriter::BrLocalProperty(this_01,BrOnHasLocalProperty,local_88.label,uVar9);
      local_88.kind = Local;
      local_88.field_2 = local_68;
    }
    else {
      aVar14.index = local_5c + 1;
      Js::ByteCodeWriter::BrEnvProperty
                (this_01,BrOnHasLocalEnvProperty,local_88.label,uVar9,aVar14.index);
      local_88.kind = Env;
      local_88.field_2.index = aVar14.index;
    }
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    Add((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)local_c0,&local_88);
    scope_01 = scope_00;
  }
  if (local_50 == (ByteCodeGenerator *)0x0 || local_5d != '\0') {
    if (local_50 != (ByteCodeGenerator *)0x0) goto LAB_0075ba82;
    PVar8 = *(PropertyId *)(recList._40_8_ + 0x1c);
LAB_0075bb66:
    uVar1 = pBStack_58->flags;
    bVar3 = (bool)((SUB41(local_64,0) | local_31) & (byte)(uVar1 >> 0x16) & 1);
    if ((uVar1 >> 10 & 1) == 0) {
      if ((uVar1 & 4) == 0) {
        OVar7 = GetStFldOpCode(local_40,true,SUB41(local_64,0),local_31,false,
                               pBStack_58->forceStrictModeForClassComputedPropertyName);
        EmitPatchableRootProperty(pBStack_58,OVar7,local_44,PVar8,false,true,local_40);
      }
      else {
        RVar10 = FuncInfo::GetEnvRegister(local_40);
        uVar9 = FuncInfo::FindOrAddInlineCacheId(local_40,RVar10,PVar8,false,true);
        OVar7 = GetScopedStFldOpCode(local_40,bVar3);
        Js::ByteCodeWriter::ElementP(this_01,OVar7,local_44,uVar9,false,true);
      }
    }
    else if ((((local_40->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) == 0) ||
            (bVar5 = FuncInfo::IsGlobalFunction(local_40), !bVar5)) {
      RVar10 = FuncInfo::GetEnvRegister(local_40);
      uVar9 = FuncInfo::FindOrAddInlineCacheId(local_40,RVar10,PVar8,false,true);
      OVar7 = GetScopedStFldOpCode(local_40,bVar3);
      Js::ByteCodeWriter::ElementP(this_01,OVar7,local_44,uVar9,false,true);
    }
    else {
      uVar9 = FuncInfo::FindOrAddInlineCacheId
                        (local_40,local_40->frameDisplayRegister,PVar8,false,true);
      OVar7 = GetScopedStFldOpCode(local_40,bVar3);
      Js::ByteCodeWriter::ElementP(this_01,OVar7,local_44,uVar9,false,true);
    }
  }
  else {
    if ((((ulong)local_50->parentScopeInfo & 0x10000) != 0) && (scope_00->func == local_40)) {
      EmitUseBeforeDeclarationRuntimeError(pBStack_58,0xffffffff);
    }
LAB_0075ba82:
    if (((ulong)local_50->parentScopeInfo & 0x80000) != 0) {
      PVar8 = Symbol::EnsurePosition((Symbol *)local_50,pBStack_58);
      goto LAB_0075bb66;
    }
    if (((ulong)local_50->parentScopeInfo & 0x200000) == 0) {
      bVar3 = Symbol::IsInSlot((Symbol *)local_50,pBStack_58,local_40,false);
      if (bVar3 || local_5c != -1) {
        if ((local_31 == false) && (((ulong)local_50->parentScopeInfo & 0x40000) != 0)) {
          Js::ByteCodeWriter::W1(this_01,RuntimeTypeError,0x41f);
        }
        funcInfo_00 = local_40;
        this_00 = local_50;
        RVar10 = Symbol::EnsureScopeSlot((Symbol *)local_50,pBStack_58,local_40);
        bVar4 = (byte)local_64 | local_31;
        local_64 = CONCAT31((int3)((uint)local_64 >> 8),bVar4);
        if (bVar4 == 0) {
          bVar3 = NeedCheckBlockVar(this_00,(Symbol *)local_50,scope_00,funcInfo_00);
          funcInfo_00 = local_40;
        }
        else {
          bVar3 = false;
        }
        OVar7 = GetStSlotOp(this_00,scope_00,local_5c,local_7c.instance,bVar3,funcInfo_00);
        if (local_5c == -1) {
          if ((local_7c.index == 0xffffffff) ||
             ((local_7c.index != local_40->frameSlotsRegister &&
              (local_7c.index != local_40->frameObjRegister)))) {
            slotId1 = scope_00->innerScopeIndex;
            if (slotId1 == 0xffffffff) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *local_78 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x12da,"(scope->HasInnerScopeIndex())",
                                 "scope->HasInnerScopeIndex()");
              if (!bVar3) {
LAB_0075c11b:
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              *local_78 = 0;
              slotId1 = scope_00->innerScopeIndex;
            }
            goto LAB_0075bd99;
          }
          Js::ByteCodeWriter::SlotI1
                    (this_01,OVar7,local_44,
                     (~*(uint *)((long)&local_50->currentBlock->pnodeNext + 4) & 2) + RVar10);
        }
        else {
          slotId1 = local_5c + 1;
LAB_0075bd99:
          Js::ByteCodeWriter::SlotI2
                    (this_01,OVar7,local_44,slotId1,
                     (~*(uint *)((long)&local_50->currentBlock->pnodeNext + 4) & 2) + RVar10);
        }
        bVar3 = ShouldTrackDebuggerMetadata(pBStack_58);
        if (((byte)local_64 & bVar3) == 1) {
          if ((scope_00->field_0x44 & 2) != 0) {
            RVar10 = *(RegSlot *)((long)&local_50->currentTopStatement + 4);
          }
          UpdateDebuggerPropertyInitializationOffset
                    (pBStack_58,RVar10,*(PropertyId *)&local_50->currentTopStatement,false);
        }
      }
      else {
        if (((local_31 == false) &&
            (local_50->funcInfoStack != (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0)
            ) && (*(OpCode *)
                   &(local_50->funcInfoStack->
                    super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
                    super_SListNodeBase<Memory::ArenaAllocator>.next == knopConstDecl)) {
          Js::ByteCodeWriter::W1(this_01,RuntimeTypeError,0x41f);
        }
        RVar10 = *(RegSlot *)((long)&local_50->currentTopStatement + 4);
        if (RVar10 != local_44) {
          Js::ByteCodeWriter::Reg2(this_01,Ld_A,RVar10,local_44);
          bVar3 = ShouldTrackDebuggerMetadata(pBStack_58);
          if ((((byte)local_64 | local_31) & bVar3) == 1) {
            UpdateDebuggerPropertyInitializationOffset
                      (pBStack_58,*(RegSlot *)((long)&local_50->currentTopStatement + 4),
                       *(PropertyId *)&local_50->currentTopStatement,true);
          }
        }
      }
    }
    else if (((local_40->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) != 0) {
      Js::ByteCodeWriter::W1(this_01,RuntimeTypeError,0x13b5);
    }
  }
  if ((int)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
           buffer != 0) {
    labelID = Js::ByteCodeWriter::DefineLabel(this_01);
    Js::ByteCodeWriter::Br(this_01,labelID);
    index = 0;
    local_6c = labelID;
    do {
      if (local_50 == (ByteCodeGenerator *)0x0) {
        PVar8 = *(PropertyId *)(recList._40_8_ + 0x1c);
      }
      else {
        PVar8 = Symbol::EnsurePosition((Symbol *)local_50,pBStack_58);
      }
      pTVar13 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_c0,index);
      Js::ByteCodeWriter::MarkLabel(this_01,pTVar13->label);
      pTVar13 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_c0,index);
      switch(pTVar13->kind) {
      case Local:
        pTVar13 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_c0,index);
        uVar9 = FuncInfo::FindOrAddInlineCacheId
                          (local_40,(pTVar13->field_2).instance,PVar8,false,true);
        Js::ByteCodeWriter::ElementP(this_01,StLocalFld,local_44,uVar9,false,true);
        goto LAB_0075c033;
      case Env:
        RVar10 = FuncInfo::AcquireTmpRegister(local_40);
        pTVar13 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_c0,index);
        Js::ByteCodeWriter::SlotI1(this_01,LdEnvObj,RVar10,(pTVar13->field_2).index);
        uVar9 = FuncInfo::FindOrAddInlineCacheId(local_40,RVar10,PVar8,false,true);
        Js::ByteCodeWriter::PatchableProperty(this_01,StFld,local_44,RVar10,uVar9,false,true);
        break;
      case LocalWith:
        RVar10 = FuncInfo::AcquireTmpRegister(local_40);
        pTVar13 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_c0,index);
        Js::ByteCodeWriter::Reg2(this_01,UnwrapWithObj,RVar10,(pTVar13->field_2).instance);
        uVar9 = FuncInfo::FindOrAddInlineCacheId(local_40,RVar10,PVar8,false,true);
        Js::ByteCodeWriter::PatchableProperty(this_01,StFld,local_44,RVar10,uVar9,false,true);
        break;
      case EnvWith:
        RVar10 = FuncInfo::AcquireTmpRegister(local_40);
        pTVar13 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_c0,index);
        Js::ByteCodeWriter::SlotI1(this_01,LdEnvObj,RVar10,(pTVar13->field_2).index);
        Js::ByteCodeWriter::Reg2(this_01,UnwrapWithObj,RVar10,RVar10);
        uVar9 = FuncInfo::FindOrAddInlineCacheId(local_40,RVar10,PVar8,false,true);
        Js::ByteCodeWriter::PatchableProperty(this_01,StFld,local_44,RVar10,uVar9,false,true);
        break;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_78 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1326,"((0))","(0)");
        if (bVar3) {
          *local_78 = 0;
          goto LAB_0075c033;
        }
        goto LAB_0075c11b;
      }
      FuncInfo::ReleaseTmpRegister(local_40,RVar10);
LAB_0075c033:
      if (index == (int)recList.
                        super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                        .buffer + -1) goto LAB_0075c053;
      Js::ByteCodeWriter::Br(this_01,local_6c);
      index = index + 1;
    } while( true );
  }
LAB_0075c05e:
  JsUtil::
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  ~List((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)local_c0);
  return;
LAB_0075c053:
  Js::ByteCodeWriter::MarkLabel(this_01,local_6c);
  goto LAB_0075c05e;
}

Assistant:

void ByteCodeGenerator::EmitPropStore(Js::RegSlot rhsLocation, Symbol *sym, IdentPtr pid, FuncInfo *funcInfo, bool isLetDecl, bool isConstDecl, bool isFncDeclVar, bool skipUseBeforeDeclarationCheck)
{
    Js::PropertyId envIndex = -1;
    Scope *symScope = sym == nullptr || sym->GetIsGlobal() ? this->globalScope : sym->GetScope();
    Assert(symScope);
    // isFncDeclVar denotes that the symbol being stored to here is the var
    // binding of a function declaration and we know we want to store directly
    // to it, skipping over any dynamic scopes that may lie in between.
    Scope *scope = nullptr;
    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::OpCode op;

    if (sym && sym->GetIsModuleExportStorage())
    {
        if (!isConstDecl && sym->GetDecl() && sym->GetDecl()->nop == knopConstDecl)
        {
            this->m_writer.W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(ERRAssignmentToConst));
        }

        EmitModuleExportAccess(sym, Js::OpCode::StModuleSlot, rhsLocation, funcInfo);
        return;
    }

    if (isFncDeclVar)
    {
        // async functions allow for the fncDeclVar to be in the body or parameter scope
        // of the parent function, so we need to calculate envIndex in lieu of the while
        // loop below.
        do
        {
            scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        } while (scope != symScope);
        Assert(scope == symScope);
        scopeLocation = scope->GetLocation();
    }

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    while (!isFncDeclVar)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            break;
        }
        if (envIndex == -1)
        {
            Assert(funcInfo == scope->GetFunc());
            scopeLocation = scope->GetLocation();
        }

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        DynamicLoadRecord rec;

        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (envIndex == -1)
            {
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    // Arrived at the scope in which the property was defined.
    if (!skipUseBeforeDeclarationCheck && sym && sym->GetNeedDeclaration() && scope->GetFunc() == funcInfo)
    {
        EmitUseBeforeDeclarationRuntimeError(this, Js::Constants::NoRegister);
        // Intentionally continue on to do normal EmitPropStore behavior so
        // that the bytecode ends up well-formed for the backend.  This is
        // in contrast to EmitPropLoad and EmitPropTypeof where they both
        // tell EmitUseBeforeDeclarationRuntimeError to emit a LdUndef in place
        // of their load and then they skip emitting their own bytecode.
        // Potayto potahto.
    }

    if (sym == nullptr || sym->GetIsGlobal())
    {
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        bool isConsoleScopeLetConst = this->IsConsoleScopeEval() && (isLetDecl || isConstDecl);
        if (this->flags & fscrEval)
        {
            if (funcInfo->byteCodeFunction->GetIsStrictMode() && funcInfo->IsGlobalFunction())
            {
                uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->frameDisplayRegister, propertyId, false, true);
                this->m_writer.ElementP(GetScopedStFldOpCode(funcInfo, isConsoleScopeLetConst), rhsLocation, cacheId);
            }
            else
            {
                uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->GetEnvRegister(), propertyId, false, true);
                // In "eval", store to a symbol with unknown scope goes through the closure environment.
                this->m_writer.ElementP(GetScopedStFldOpCode(funcInfo, isConsoleScopeLetConst), rhsLocation, cacheId);
            }
        }
        else if (this->flags & fscrImplicitThis)
        {
            uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->GetEnvRegister(), propertyId, false, true);

            // In HTML event handler, store to a symbol with unknown scope goes through the closure environment.
            this->m_writer.ElementP(GetScopedStFldOpCode(funcInfo, isConsoleScopeLetConst), rhsLocation, cacheId);
        }
        else
        {
            this->EmitPatchableRootProperty(GetStFldOpCode(funcInfo, true, isLetDecl, isConstDecl, false, forceStrictModeForClassComputedPropertyName), rhsLocation, propertyId, false, true, funcInfo);
        }
    }
    else if (sym->GetIsFuncExpr())
    {
        // Store to function expr variable.

        // strict mode: we need to throw type error
        if (funcInfo->byteCodeFunction->GetIsStrictMode())
        {
            // Note that in this case the sym's location belongs to the parent function, so we can't use it.
            // It doesn't matter which register we use, as long as it's valid for this function.
            this->m_writer.W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(JSERR_CantAssignToReadOnly));
        }
    }
    else if (sym->IsInSlot(this, funcInfo) || envIndex != -1)
    {
        if (!isConstDecl && sym->GetIsConst())
        {
            // This is a case where const reassignment can't be proven statically (e.g., eval, with) so
            // we have to catch it at runtime.
            this->m_writer.W1(
                Js::OpCode::RuntimeTypeError, SCODE_CODE(ERRAssignmentToConst));
        }
        // Make sure the property has a slot. This will bump up the size of the slot array if necessary.
        Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
        bool chkBlockVar = !isLetDecl && !isConstDecl && NeedCheckBlockVar(sym, scope, funcInfo);

        // The property is in memory rather than register. We'll have to load it from the slots.
        op = this->GetStSlotOp(scope, envIndex, scopeLocation, chkBlockVar, funcInfo);

        if (envIndex != -1)
        {
            this->m_writer.SlotI2(op, rhsLocation,
                envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var),
                slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex));
        }
        else if (scopeLocation != Js::Constants::NoRegister &&
            (scopeLocation == funcInfo->frameSlotsRegister || scopeLocation == funcInfo->frameObjRegister))
        {
            this->m_writer.SlotI1(op, rhsLocation,
                slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex));
        }
        else
        {
            Assert(scope->HasInnerScopeIndex());
            this->m_writer.SlotI2(op, rhsLocation, scope->GetInnerScopeIndex(),
                slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex));
        }

        if (this->ShouldTrackDebuggerMetadata() && (isLetDecl || isConstDecl))
        {
            Js::PropertyId location = scope->GetIsObject() ? sym->GetLocation() : slot;
            this->UpdateDebuggerPropertyInitializationOffset(location, sym->GetPosition(), false);
        }
    }
    else
    {
        if (!isConstDecl && sym->GetDecl() && sym->GetDecl()->nop == knopConstDecl)
        {
            // This is a case where const reassignment can't be proven statically (e.g., eval, with) so
            // we have to catch it at runtime.
            this->m_writer.W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(ERRAssignmentToConst));
        }
        if (rhsLocation != sym->GetLocation())
        {
            this->m_writer.Reg2(Js::OpCode::Ld_A, sym->GetLocation(), rhsLocation);

            if (this->ShouldTrackDebuggerMetadata() && (isLetDecl || isConstDecl))
            {
                this->UpdateDebuggerPropertyInitializationOffset(sym->GetLocation(), sym->GetPosition());
            }
        }
    }

    
    if (!recList.Empty())
    {
        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            uint cacheId;
            Js::RegSlot instLocation;
            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();

            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    cacheId = funcInfo->FindOrAddInlineCacheId(recList.Item(i).instance, propertyId, false, true);
                    this->m_writer.ElementP(Js::OpCode::StLocalFld, rhsLocation, cacheId);
                    break;

                case DynamicLoadKind::Env:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, true);
                    this->m_writer.PatchableProperty(Js::OpCode::StFld, rhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::LocalWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, recList.Item(i).instance);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, true);
                    this->m_writer.PatchableProperty(Js::OpCode::StFld, rhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::EnvWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, instLocation);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, true);
                    this->m_writer.PatchableProperty(Js::OpCode::StFld, rhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }
        this->m_writer.MarkLabel(doneLabel);
    }
}